

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

void hd_ringbuf_free(nghttp2_hd_ringbuf *ringbuf,nghttp2_mem *mem)

{
  nghttp2_hd_entry *ent_00;
  nghttp2_hd_entry *ent;
  size_t i;
  nghttp2_mem *mem_local;
  nghttp2_hd_ringbuf *ringbuf_local;
  
  if (ringbuf != (nghttp2_hd_ringbuf *)0x0) {
    for (ent = (nghttp2_hd_entry *)0x0; ent < (nghttp2_hd_entry *)ringbuf->len;
        ent = (nghttp2_hd_entry *)((long)&(ent->nv).name + 1)) {
      ent_00 = hd_ringbuf_get(ringbuf,(size_t)ent);
      nghttp2_hd_entry_free(ent_00);
      nghttp2_mem_free(mem,ent_00);
    }
    nghttp2_mem_free(mem,ringbuf->buffer);
  }
  return;
}

Assistant:

static void hd_ringbuf_free(nghttp2_hd_ringbuf *ringbuf, nghttp2_mem *mem) {
  size_t i;
  if (ringbuf == NULL) {
    return;
  }
  for (i = 0; i < ringbuf->len; ++i) {
    nghttp2_hd_entry *ent = hd_ringbuf_get(ringbuf, i);

    nghttp2_hd_entry_free(ent);
    nghttp2_mem_free(mem, ent);
  }
  nghttp2_mem_free(mem, ringbuf->buffer);
}